

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFPageObjectHelper::placeFormXObject
          (string *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          string *name,Rectangle rect,QPDFMatrix *cm,bool invert_transformations,bool allow_shrink,
          bool allow_expand)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e0 [32];
  double local_c0;
  double dStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)fo);
  getMatrixForFormXObjectPlacement
            ((QPDFMatrix *)local_e0,this,(QPDFObjectHandle *)&local_f0,rect,invert_transformations,
             allow_shrink,allow_expand);
  cm->e = local_c0;
  cm->f = dStack_b8;
  cm->c = (double)local_e0._16_8_;
  cm->d = (double)local_e0._24_8_;
  cm->a = (double)local_e0._0_8_;
  cm->b = (double)local_e0._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  QPDFMatrix::unparse_abi_cxx11_(&local_50,cm);
  std::operator+(&local_b0,"q\n",&local_50);
  std::operator+(&local_90,&local_b0," cm\n");
  std::operator+(&local_70,&local_90,name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &local_70," Do\n");
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,"Q\n"
                );
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFPageObjectHelper::placeFormXObject(
    QPDFObjectHandle fo,
    std::string const& name,
    QPDFObjectHandle::Rectangle rect,
    QPDFMatrix& cm,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    cm = getMatrixForFormXObjectPlacement(
        fo, rect, invert_transformations, allow_shrink, allow_expand);
    return ("q\n" + cm.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}